

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O2

void UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UChar UVar1;
  byte *targetLimit;
  UConverter *pUVar2;
  void *pvVar3;
  UConverter *pUVar4;
  uint uVar5;
  UErrorCode UVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  char cVar11;
  long lVar12;
  UChar *pUVar13;
  byte *pbVar14;
  byte *pbVar15;
  UChar *pUVar16;
  UChar *pUVar17;
  UConverterDataISO2022 *myConverterData;
  UConverter *saveConv;
  bool bVar18;
  uint32_t targetByteUnit;
  UChar *local_60;
  int32_t *offsets;
  UConverterFromUnicodeArgs *local_50;
  byte *local_48;
  uint local_40;
  int local_3c;
  UConverterSharedData *local_38;
  
  pUVar17 = args->source;
  pUVar13 = args->sourceLimit;
  pbVar15 = (byte *)args->target;
  targetLimit = (byte *)args->targetLimit;
  offsets = args->offsets;
  targetByteUnit = 0;
  pUVar2 = args->converter;
  pvVar3 = pUVar2->extraInfo;
  pUVar4 = *(UConverter **)((long)pvVar3 + 0x50);
  local_48 = pbVar15;
  if (*(int *)((long)pvVar3 + 0x6c) == 1) {
    args->converter = pUVar4;
    pUVar4->fromUChar32 = pUVar2->fromUChar32;
    ucnv_MBCSFromUnicodeWithOffsets_63(args,err);
    lVar12 = *(long *)((long)pvVar3 + 0x50);
    pUVar2->fromUChar32 = *(UChar32 *)(lVar12 + 0x54);
    if (*err == U_BUFFER_OVERFLOW_ERROR) {
      cVar11 = *(char *)(lVar12 + 0x5b);
      if (0 < (long)cVar11) {
        memcpy(pUVar2->charErrorBuffer,(void *)(lVar12 + 0x68),(long)cVar11);
        lVar12 = *(long *)((long)pvVar3 + 0x50);
        cVar11 = *(char *)(lVar12 + 0x5b);
      }
      pUVar2->charErrorBufferLength = cVar11;
      *(undefined1 *)(lVar12 + 0x5b) = 0;
    }
    args->converter = pUVar2;
  }
  else {
    cVar11 = (char)pUVar2->fromUnicodeStatus;
    uVar7 = pUVar2->fromUChar32;
    if (uVar7 == 0 || targetLimit <= pbVar15) {
      local_38 = pUVar4->sharedData;
      local_3c = (int)pUVar2->useFallback;
      pUVar16 = pUVar17;
      local_60 = pUVar13;
      local_50 = args;
      for (; pUVar16 = pUVar16 + 1, args = local_50, pUVar17 < local_60; pUVar17 = pUVar17 + 1) {
        targetByteUnit = 0xffff;
        if (local_50->targetLimit <= pbVar15) {
          *err = U_BUFFER_OVERFLOW_ERROR;
          goto LAB_002f3ebc;
        }
        UVar1 = *pUVar17;
        local_40 = (uint)(ushort)UVar1;
        if (((ushort)UVar1 < 0x20) && ((0x800c000U >> ((ushort)UVar1 & 0x1f) & 1) != 0)) {
          *err = U_ILLEGAL_CHAR_FOUND;
          local_50->converter->fromUChar32 = local_40;
          pUVar17 = pUVar17 + 1;
          goto LAB_002f3ebc;
        }
        uVar5 = MBCS_FROM_UCHAR32_ISO2022(local_38,local_40,&targetByteUnit,(UBool)local_3c,1);
        uVar7 = -uVar5;
        if (0 < (int)uVar5) {
          uVar7 = uVar5;
        }
        if ((((uVar5 == 0) || (2 < uVar7)) || (uVar7 == 1 && 0x7f < targetByteUnit)) ||
           ((uVar7 == 2 &&
            ((0x5d5d < (targetByteUnit + 0x5e5f & 0xfffe) || (0x5d < (targetByteUnit + 0x5f & 0xfe))
             ))))) {
          targetByteUnit = 0xffff;
LAB_002f3dc3:
          pUVar17 = pUVar17 + 1;
          args = local_50;
          pUVar13 = local_60;
          uVar7 = local_40;
          if ((local_40 & 0xf800) == 0xd800) {
            local_48 = pbVar15;
            if ((local_40 >> 10 & 1) == 0) goto LAB_002f3aee;
            UVar6 = U_ILLEGAL_CHAR_FOUND;
          }
          else {
            UVar6 = U_INVALID_CHAR_FOUND;
            local_48 = pbVar15;
          }
          goto LAB_002f3dfe;
        }
        if (targetByteUnit == 0xffff) goto LAB_002f3dc3;
        pbVar14 = pbVar15;
        if ((int)cVar11 != (uint)(0xff < targetByteUnit)) {
          *pbVar15 = 0xff < targetByteUnit ^ 0xf;
          pbVar14 = pbVar15 + 1;
          if (offsets != (int32_t *)0x0) {
            *offsets = (int)((ulong)((long)pUVar16 - (long)local_50->source) >> 1) + -1;
            offsets = offsets + 1;
          }
        }
        bVar8 = (byte)targetByteUnit;
        if (targetByteUnit < 0x100) {
          if (pbVar14 < targetLimit) {
            *pbVar14 = bVar8;
            pbVar15 = pbVar14 + 1;
LAB_002f3ceb:
            if (offsets != (int32_t *)0x0) {
              *offsets = (int)((ulong)((long)pUVar16 - (long)local_50->source) >> 1) + -1;
              offsets = offsets + 1;
            }
          }
          else {
            pUVar2 = local_50->converter;
            cVar11 = pUVar2->charErrorBufferLength;
            pUVar2->charErrorBufferLength = cVar11 + '\x01';
            pUVar2->charErrorBuffer[cVar11] = bVar8;
LAB_002f3d53:
            *err = U_BUFFER_OVERFLOW_ERROR;
            pbVar15 = pbVar14;
          }
        }
        else {
          bVar9 = (char)(targetByteUnit >> 8) + 0x80;
          if (targetLimit <= pbVar14) {
            pUVar2 = local_50->converter;
            cVar11 = pUVar2->charErrorBufferLength;
            pUVar2->charErrorBufferLength = cVar11 + '\x01';
            pUVar2->charErrorBuffer[cVar11] = bVar9;
            pUVar2 = local_50->converter;
            cVar11 = pUVar2->charErrorBufferLength;
            pUVar2->charErrorBufferLength = cVar11 + '\x01';
            pUVar2->charErrorBuffer[cVar11] = bVar8 + 0x80;
            goto LAB_002f3d53;
          }
          *pbVar14 = bVar9;
          if (offsets != (int32_t *)0x0) {
            *offsets = (int)((ulong)((long)pUVar16 - (long)local_50->source) >> 1) + -1;
            offsets = offsets + 1;
          }
          pbVar15 = pbVar14 + 1;
          if (pbVar15 < targetLimit) {
            pbVar14[1] = bVar8 + 0x80;
            pbVar15 = pbVar14 + 2;
            goto LAB_002f3ceb;
          }
          pUVar2 = local_50->converter;
          cVar11 = pUVar2->charErrorBufferLength;
          pUVar2->charErrorBufferLength = cVar11 + '\x01';
          pUVar2->charErrorBuffer[cVar11] = bVar8 + 0x80;
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        cVar11 = 0xff < targetByteUnit;
      }
      UVar6 = *err;
      pUVar13 = local_60;
      local_48 = pbVar15;
    }
    else {
LAB_002f3aee:
      UVar6 = U_ZERO_ERROR;
      if (pUVar17 < pUVar13) {
        bVar18 = ((ushort)*pUVar17 & 0xfc00) == 0xdc00;
        UVar6 = (uint)!bVar18 * 2 + U_INVALID_CHAR_FOUND;
        if (bVar18) {
          uVar7 = uVar7 * 0x400 + (uint)(ushort)*pUVar17 + 0xfca02400;
        }
        pUVar17 = pUVar17 + bVar18;
      }
LAB_002f3dfe:
      *err = UVar6;
      args->converter->fromUChar32 = uVar7;
    }
    pbVar15 = local_48;
    if (((UVar6 < U_ILLEGAL_ARGUMENT_ERROR) && (cVar11 != '\0')) &&
       ((args->flush != '\0' && ((pUVar13 <= pUVar17 && (args->converter->fromUChar32 == 0)))))) {
      pUVar13 = args->source;
      iVar10 = (int)((ulong)((long)pUVar17 - (long)pUVar13) >> 1);
      if (iVar10 < 1) {
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = iVar10 - 1;
        if (((pUVar13[uVar7] & 0xfc00U) == 0xdc00) &&
           ((uVar7 == 0 || ((pUVar13[iVar10 - 2] & 0xfc00U) == 0xd800)))) {
          uVar7 = iVar10 - 2;
        }
      }
      fromUWriteUInt8(args->converter,"\x0f",1,&local_48,(char *)targetLimit,&offsets,uVar7,err);
      cVar11 = '\0';
      pbVar15 = local_48;
    }
LAB_002f3ebc:
    args->source = pUVar17;
    args->target = (char *)pbVar15;
    args->converter->fromUnicodeStatus = (int)cVar11;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err){

    const UChar *source = args->source;
    const UChar *sourceLimit = args->sourceLimit;
    unsigned char *target = (unsigned char *) args->target;
    unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    int32_t* offsets = args->offsets;
    uint32_t targetByteUnit = 0x0000;
    UChar32 sourceChar = 0x0000;
    UBool isTargetByteDBCS;
    UBool oldIsTargetByteDBCS;
    UConverterDataISO2022 *converterData;
    UConverterSharedData* sharedData;
    UBool useFallback;
    int32_t length =0;

    converterData=(UConverterDataISO2022*)args->converter->extraInfo;
    /* if the version is 1 then the user is requesting
     * conversion with ibm-25546 pass the arguments to
     * MBCS converter and return
     */
    if(converterData->version==1){
        UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
        return;
    }

    /* initialize data */
    sharedData = converterData->currentConverter->sharedData;
    useFallback = args->converter->useFallback;
    isTargetByteDBCS=(UBool)args->converter->fromUnicodeStatus;
    oldIsTargetByteDBCS = isTargetByteDBCS;

    isTargetByteDBCS   = (UBool) args->converter->fromUnicodeStatus;
    if((sourceChar = args->converter->fromUChar32)!=0 && target <targetLimit) {
        goto getTrail;
    }
    while(source < sourceLimit){

        targetByteUnit = missingCharMarker;

        if(target < (unsigned char*) args->targetLimit){
            sourceChar = *source++;

            /* do not convert SO/SI/ESC */
            if(IS_2022_CONTROL(sourceChar)) {
                /* callback(illegal) */
                *err=U_ILLEGAL_CHAR_FOUND;
                args->converter->fromUChar32=sourceChar;
                break;
            }

            length = MBCS_FROM_UCHAR32_ISO2022(sharedData,sourceChar,&targetByteUnit,useFallback,MBCS_OUTPUT_2);
            if(length < 0) {
                length = -length;  /* fallback */
            }
            /* only DBCS or SBCS characters are expected*/
            /* DB characters with high bit set to 1 are expected */
            if( length > 2 || length==0 ||
                (length == 1 && targetByteUnit > 0x7f) ||
                (length == 2 &&
                    ((uint16_t)(targetByteUnit - 0xa1a1) > (0xfefe - 0xa1a1) ||
                    (uint8_t)(targetByteUnit - 0xa1) > (0xfe - 0xa1)))
            ) {
                targetByteUnit=missingCharMarker;
            }
            if (targetByteUnit != missingCharMarker){

                oldIsTargetByteDBCS = isTargetByteDBCS;
                isTargetByteDBCS = (UBool)(targetByteUnit>0x00FF);
                  /* append the shift sequence */
                if (oldIsTargetByteDBCS != isTargetByteDBCS ){

                    if (isTargetByteDBCS)
                        *target++ = UCNV_SO;
                    else
                        *target++ = UCNV_SI;
                    if(offsets)
                        *(offsets++) = (int32_t)(source - args->source-1);
                }
                /* write the targetUniChar  to target */
                if(targetByteUnit <= 0x00FF){
                    if( target < targetLimit){
                        *(target++) = (unsigned char) targetByteUnit;
                        if(offsets){
                            *(offsets++) = (int32_t)(source - args->source-1);
                        }

                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit);
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }else{
                    if(target < targetLimit){
                        *(target++) =(unsigned char) ((targetByteUnit>>8) -0x80);
                        if(offsets){
                            *(offsets++) = (int32_t)(source - args->source-1);
                        }
                        if(target < targetLimit){
                            *(target++) =(unsigned char) (targetByteUnit -0x80);
                            if(offsets){
                                *(offsets++) = (int32_t)(source - args->source-1);
                            }
                        }else{
                            args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit -0x80);
                            *err = U_BUFFER_OVERFLOW_ERROR;
                        }
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) ((targetByteUnit>>8) -0x80);
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit-0x80);
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }

            }
            else{
                /* oops.. the code point is unassingned
                 * set the error and reason
                 */

                /*check if the char is a First surrogate*/
                if(U16_IS_SURROGATE(sourceChar)) {
                    if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                        /*look ahead to find the trail surrogate*/
                        if(source <  sourceLimit) {
                            /* test the following code unit */
                            UChar trail=(UChar) *source;
                            if(U16_IS_TRAIL(trail)) {
                                source++;
                                sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                                *err = U_INVALID_CHAR_FOUND;
                                /* convert this surrogate code point */
                                /* exit this condition tree */
                            } else {
                                /* this is an unmatched lead code unit (1st surrogate) */
                                /* callback(illegal) */
                                *err=U_ILLEGAL_CHAR_FOUND;
                            }
                        } else {
                            /* no more input */
                            *err = U_ZERO_ERROR;
                        }
                    } else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err=U_ILLEGAL_CHAR_FOUND;
                    }
                } else {
                    /* callback(unassigned) for a BMP code point */
                    *err = U_INVALID_CHAR_FOUND;
                }

                args->converter->fromUChar32=sourceChar;
                break;
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-KR conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        isTargetByteDBCS &&
        args->flush && source>=sourceLimit && args->converter->fromUChar32==0
    ) {
        int32_t sourceIndex;

        /* we are switching to ASCII */
        isTargetByteDBCS=FALSE;

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            args->converter,
            SHIFT_IN_STR, 1,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
    args->converter->fromUnicodeStatus = (uint32_t)isTargetByteDBCS;
}